

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsItemActivated(void)

{
  ImGuiWindow *window;
  ImGuiContext *g;
  
  if (((GImGui->ActiveId == 0) || (GImGui->ActiveId != (GImGui->CurrentWindow->DC).LastItemId)) ||
     (GImGui->ActiveIdPreviousFrame == (GImGui->CurrentWindow->DC).LastItemId)) {
    g._7_1_ = false;
  }
  else {
    g._7_1_ = true;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::IsItemActivated()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId)
    {
        ImGuiWindow* window = g.CurrentWindow;
        if (g.ActiveId == window->DC.LastItemId && g.ActiveIdPreviousFrame != window->DC.LastItemId)
            return true;
    }
    return false;
}